

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O0

void __thiscall
FIX::Message::Message
          (Message *this,message_order *hdrOrder,message_order *trlOrder,message_order *order,
          string *string,DataDictionary *dataDictionary,bool validate)

{
  bool validate_local;
  DataDictionary *dataDictionary_local;
  string *string_local;
  message_order *order_local;
  message_order *trlOrder_local;
  message_order *hdrOrder_local;
  Message *this_local;
  
  FieldMap::FieldMap(&this->super_FieldMap,order);
  (this->super_FieldMap)._vptr_FieldMap = (_func_int **)&PTR__Message_0030c368;
  Header::Header(&this->m_header,hdrOrder);
  Trailer::Trailer(&this->m_trailer,trlOrder);
  this->m_validStructure = true;
  setString(this,string,validate,dataDictionary,dataDictionary);
  return;
}

Assistant:

Message::Message( const message_order &hdrOrder,
                  const message_order &trlOrder,
                  const message_order& order,
                  const std::string& string,
                  const DataDictionary& dataDictionary,
                  bool validate )
EXCEPT ( InvalidMessage )
: FieldMap(order), m_header(hdrOrder),
  m_trailer(trlOrder), m_validStructure( true )
{
  setString( string, validate, &dataDictionary, &dataDictionary );
}